

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_bea9::ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U>::runTest
          (ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *this,char *unrecognizedKey,
          char *proprietaryKey)

{
  AssertHelperData *pAVar1;
  ktx_uint8_t *pkVar2;
  undefined4 uVar3;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  uint *__s2;
  ulong uVar9;
  uint32_t i;
  long lVar10;
  KTX_header2 *pKVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  char *pcVar12;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  ktx_uint8_t **ppkVar13;
  int *piVar14;
  ktx_uint64_t levelOffset;
  ktx_uint64_t offset;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxHashList *hlists [2];
  ktx_uint8_t *ktxMemFile;
  ktxTexture1 *texture;
  ktxHashList *hl;
  ktx_uint32_t kvDataLen;
  char rubbishValue [19];
  ktx_uint8_t *kvData;
  ktxHashListEntry *pWriter;
  ktx_size_t ktxMemFileLen;
  AssertHelper local_100;
  AssertHelper local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  AssertHelper local_c8;
  ktx_error_code_e local_bc;
  AssertHelper local_b8 [2];
  KTX_header2 *local_a8;
  ktxTexture1 *local_a0;
  undefined8 local_98;
  uint local_8c;
  Message local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined3 uStack_78;
  ktxTexture1WriteKTX2TestBase<unsigned_char,_3U,_32849U> *local_68;
  AssertHelper local_60;
  KTX_header2 *local_58;
  void *local_50;
  TextureWriterTestHelper<unsigned_char,_3U,_32849U> *local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  
  local_a0 = (ktxTexture1 *)0x0;
  local_68 = this;
  local_bc = ktxTexture1_Create(&(this->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).
                                 helper.createInfo,1);
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_e8,"result","KTX_SUCCESS",&local_bc,(ktx_error_code_e *)&local_88);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message(&local_88);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x787,pcVar12);
    testing::internal::AssertHelper::operator=(local_b8,&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    if ((long *)CONCAT44(local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_88.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_88.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = local_a0 != (ktxTexture1 *)0x0;
  uStack_80._0_1_ = '\0';
  uStack_80._1_1_ = '\0';
  uStack_80._2_1_ = '\0';
  uStack_80._3_1_ = '\0';
  uStack_7c = 0;
  if (local_a0 == (ktxTexture1 *)0x0) {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&uStack_80;
    testing::Message::Message((Message *)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_b8[0].data_)->line,"ktxTexture1_Create failed: ",0x1b);
    pcVar12 = (char *)ktxErrorString(local_bc);
    ppkVar13 = (ktx_uint8_t **)&(local_b8[0].data_)->line;
    if (pcVar12 == (char *)0x0) {
      sVar7 = 6;
      pcVar12 = "(null)";
    }
    else {
      sVar7 = strlen(pcVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppkVar13,pcVar12,sVar7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_88,(AssertionResult *)0x17896e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x788,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    if (local_b8[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(ktxHashList *)local_b8[0].data_ + 8))();
    }
    __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uStack_7c,uStack_80);
LAB_00133c4d:
    if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_01,__ptr_00);
    return;
  }
  local_48 = &(local_68->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper;
  ktxHashList_Create(&local_98);
  local_b8[0].data_ = (AssertHelperData *)&local_a0->kvDataHead;
  local_b8[1].data_ = (AssertHelperData *)local_98;
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = 's';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._1_1_ = 'o';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._2_1_ = 'm';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._3_1_ = 'e';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = ' ';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_1_ = 'r';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_1_ = 'u';
  local_88.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 'b';
  uStack_80._0_1_ = 'b';
  uStack_80._1_1_ = 'i';
  uStack_80._2_1_ = 's';
  uStack_80._3_1_ = 'h';
  uStack_7c = 0x6c617620;
  uStack_78 = 0x6575;
  lVar10 = 0;
  do {
    pAVar1 = local_b8[lVar10].data_;
    ktxHashList_AddKVPair
              (pAVar1,"KTXwriter",
               (int)(local_68->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
                    super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_string_length,
               (local_68->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
               super_WriterTestHelper<unsigned_char,_3U,_32849U>.writer_ktx2._M_dataplus._M_p);
    if (unrecognizedKey != (char *)0x0) {
      ktxHashList_AddKVPair(pAVar1,unrecognizedKey,0x13,&local_88);
    }
    if (proprietaryKey != (char *)0x0) {
      ktxHashList_AddKVPair(pAVar1,proprietaryKey,0x13,&local_88);
    }
    ktxHashList_Sort(pAVar1);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  ktxHashList_FindEntry(local_98,"KTXwriter",&local_40);
  appendLibId(local_98,local_40);
  ktxHashList_Sort(local_98);
  ktxHashList_Serialize(local_98,&local_8c,&local_50);
  ktxHashList_Destruct(local_98);
  this_00 = local_48;
  local_bc = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::copyImagesToTexture
                       (local_48,local_a0);
  local_f8.data_ = (AssertHelperData *)((ulong)local_f8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_e8,"result","KTX_SUCCESS",&local_bc,(ktx_error_code_e *)&local_f8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7ac,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  bVar4 = TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
                    (this_00,local_a0->pData);
  local_f8.data_._0_1_ = bVar4;
  local_100.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"helper.compareTexture1Images(texture->pData)","true",
             (bool *)&local_f8,(bool *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7ae,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  local_bc = ktxTexture1_WriteKTX2ToMemory(local_a0,&local_a8,local_38);
  pKVar11 = local_a8;
  uVar3 = local_f8.data_._4_4_;
  if (unrecognizedKey != (char *)0x0) {
    local_f8.data_._0_4_ = 10;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_e8,"result","KTX_INVALID_OPERATION",&local_bc,
               (ktx_error_code_e *)&local_f8);
    if (local_e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (local_e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0x7dc,pcVar12);
      testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_100);
      if (local_f8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_f8.data_ + 8))();
      }
    }
    if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e0,local_e0);
    }
    goto LAB_00133b7e;
  }
  local_f8.data_._0_1_ = local_bc == KTX_SUCCESS;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_bc != KTX_SUCCESS) {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f0;
    testing::Message::Message((Message *)&local_100);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(local_100.data_)->line,"ktxTexture_WriteKTX2ToMemory failed: ",0x25);
    pcVar12 = (char *)ktxErrorString(local_bc);
    piVar14 = &(local_100.data_)->line;
    if (pcVar12 == (char *)0x0) {
      sVar7 = 6;
      pcVar12 = "(null)";
    }
    else {
      sVar7 = strlen(pcVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)piVar14,pcVar12,sVar7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)&local_f8,(AssertionResult *)"result == KTX_SUCCESS",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7b5,(char *)CONCAT71(local_e8._1_7_,local_e8[0]));
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e8._1_7_,local_e8[0]) != &local_d8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_e8._1_7_,local_e8[0]),local_d8._M_allocated_capacity + 1);
    }
    __ptr_00 = local_f0;
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
      __ptr_00 = local_f0;
    }
    goto LAB_00133c4d;
  }
  uVar9 = 0xab4b5458203230bb;
  uVar8 = *(ulong *)local_a8->identifier;
  uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
          (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
  if (uVar8 == 0xab4b5458203230bb) {
    uVar5 = *(uint *)(local_a8->identifier + 8);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar8 = (ulong)uVar5;
    local_f8.data_._0_4_ = 0;
    if (uVar5 != 0xd0a1a0a) {
      uVar9 = 0xd0a1a0a;
      goto LAB_00133abd;
    }
  }
  else {
LAB_00133abd:
    local_f8.data_._0_4_ = -(uint)(uVar8 < uVar9) | 1;
  }
  local_f8.data_ = (AssertHelperData *)CONCAT44(uVar3,(uint)local_f8.data_);
  local_100.data_ = local_100.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"memcmp(header, ktxId2, sizeof(ktxId2))","0",(int *)&local_f8,
             (int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7ba,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  bVar4 = WriterTestHelper<unsigned_char,_3U,_32849U>::texinfo::compare
                    (&(local_68->super_ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>).helper.
                      super_WriterTestHelper<unsigned_char,_3U,_32849U>.texinfo,pKVar11);
  local_f8.data_._0_1_ = bVar4;
  local_100.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"helper.texinfo.compare(header)","true",(bool *)&local_f8,
             (bool *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7bb,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  __s2 = (uint *)vk2dfd(pKVar11->vkFormat);
  iVar6 = memcmp(local_a8->identifier + (pKVar11->dataFormatDescriptor).byteOffset,__s2,(ulong)*__s2
                );
  local_f8.data_._0_4_ = iVar6;
  local_100.data_ = local_100.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,
             "memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset, dfd, *dfd)","0",
             (int *)&local_f8,(int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7c1,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  uVar5 = (pKVar11->keyValueData).byteOffset;
  pkVar2 = local_a8->identifier;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_e8,"header->keyValueData.byteLength","kvDataLen",
             &(pKVar11->keyValueData).byteLength,&local_8c);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7c5,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  iVar6 = memcmp(pkVar2 + uVar5,local_50,(ulong)local_8c);
  local_f8.data_._0_4_ = iVar6;
  local_100.data_ = local_100.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_e8,"memcmp(filePtr, kvData, kvDataLen)","0",(int *)&local_f8,
             (int *)&local_100);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7c6,pcVar12);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  pKVar11 = local_a8 + 1;
  local_f8.data_ = (AssertHelperData *)0xffffffffffffffff;
  local_58 = pKVar11;
  if ((this_00->super_WriterTestHelper<unsigned_char,_3U,_32849U>).numLevels != 0) {
    uVar8 = 0;
    do {
      local_100.data_ = *(AssertHelperData **)pKVar11->identifier;
      local_c8.data_ =
           (AssertHelperData *)(local_100.data_ % (ulong)local_68->requiredLevelAlignment);
      local_60.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)local_e8,"levelOffset % requiredLevelAlignment","0U",
                 (unsigned_long *)&local_c8,(uint *)&local_60);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        pcVar12 = "";
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x7d1,pcVar12);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,local_e0);
      }
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_e8,"levelOffset","offset",(unsigned_long *)&local_100,
                 (unsigned_long *)&local_f8);
      if (local_e8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_c8);
        pcVar12 = "";
        if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = (local_e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0x7d4,pcVar12);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_c8);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if (local_c8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_c8.data_ + 8))();
        }
      }
      if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,local_e0);
      }
      local_f8.data_ = local_100.data_;
      uVar8 = uVar8 + 1;
      pKVar11 = (KTX_header2 *)&pKVar11->pixelHeight;
    } while (uVar8 < (this_00->super_WriterTestHelper<unsigned_char,_3U,_32849U>).numLevels);
  }
  bVar4 = WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
                    (&this_00->super_WriterTestHelper<unsigned_char,_3U,_32849U>,
                     (ktxLevelIndexEntry *)local_58,local_a8->identifier);
  local_100.data_._0_1_ = bVar4;
  local_c8.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_e8,"helper.compareRawImages(levelIndex, ktxMemFile)","true",
             (bool *)&local_100,(bool *)&local_c8);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0x7d8,pcVar12);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_100.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_100.data_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if (local_a8 != (KTX_header2 *)0x0) {
    operator_delete(local_a8,1);
  }
LAB_00133b7e:
  (*local_a0->vtbl->Destroy)((ktxTexture *)local_a0);
  if (local_50 != (void *)0x0) {
    operator_delete(local_50,1);
  }
  return;
}

Assistant:

void runTest(const char* unrecognizedKey, const char* proprietaryKey) {
        ktxTexture1* texture = 0;
        KTX_error_code result;
        ktx_uint8_t* ktxMemFile;
        ktx_size_t ktxMemFileLen;
        ktx_uint8_t* filePtr;
        ktx_uint8_t* kvData;
        ktx_uint32_t kvDataLen;

        result = ktxTexture1_Create(&helper.createInfo,
                                   KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                   &texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture1_Create failed: "
                                     << ktxErrorString(result);

        ktxHashList* hl;
        ktxHashList_Create(&hl);
        ktxHashList* hlists[2] = {&texture->kvDataHead, hl};
        // Add desired keys & values to both the texture and a comparator.
        char rubbishValue[] = "some rubbish value";
        for (uint32_t i = 0; i < 2; i++) {
            // N.B. Writer metadata is not legal in a KTX v1 file but we know
            // we're going to write this out as a v2 file so okay.
            ktxHashList_AddKVPair(hlists[i], KTX_WRITER_KEY,
                                  (uint32_t)helper.writer_ktx2.size(),
                                  helper.writer_ktx2.data());
            if (unrecognizedKey) {
                ktxHashList_AddKVPair(hlists[i], unrecognizedKey,
                                      sizeof(rubbishValue),
                                      rubbishValue);
            }
            if (proprietaryKey) {
                ktxHashList_AddKVPair(hlists[i], proprietaryKey,
                                      sizeof(rubbishValue),
                                      rubbishValue);
            }
            ktxHashList_Sort(hlists[i]);
        }
        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(hl, KTX_WRITER_KEY, &pWriter);
        appendLibId(hl, pWriter);
        ktxHashList_Sort(hl);
        ktxHashList_Serialize(hl, &kvDataLen, &kvData);
        ktxHashList_Destruct(hl);

        result = helper.copyImagesToTexture(texture);
        EXPECT_EQ(result, KTX_SUCCESS);

        EXPECT_EQ(helper.compareTexture1Images(texture->pData), true);

        result = ktxTexture1_WriteKTX2ToMemory(texture,
                                               &ktxMemFile,
                                               &ktxMemFileLen);

        if (unrecognizedKey == NULL) {
            ASSERT_TRUE(result == KTX_SUCCESS) << "ktxTexture_WriteKTX2ToMemory failed: "
                                               << ktxErrorString(result);

            KTX_header2* header = (KTX_header2*)ktxMemFile;

            EXPECT_EQ(memcmp(header, ktxId2, sizeof(ktxId2)), 0);
            EXPECT_EQ(helper.texinfo.compare(header), true);

            // Check the format descriptor.
            ktx_uint32_t* dfd = vk2dfd(static_cast<VkFormat>(header->vkFormat));
            EXPECT_EQ(memcmp(ktxMemFile + header->dataFormatDescriptor.byteOffset,
                             dfd,
                             *dfd), 0);

            // Check the metadata.
            filePtr = ktxMemFile + header->keyValueData.byteOffset;
            EXPECT_EQ(header->keyValueData.byteLength, kvDataLen);
            EXPECT_EQ(memcmp(filePtr, kvData, kvDataLen), 0);
            filePtr += helper.kvDataLen;

            // Offset of level 0 is first item in leveIndex after header.
            ktxLevelIndexEntry* levelIndex =
                reinterpret_cast<ktxLevelIndexEntry*>(ktxMemFile + sizeof(*header));

            ktx_uint64_t offset = UINT64_MAX;
            for (ktx_uint32_t level = 0; level < helper.numLevels; level++) {
                ktx_uint64_t levelOffset = levelIndex[level].byteOffset;
                // Check offset is properly aligned.
                EXPECT_EQ(levelOffset % requiredLevelAlignment, 0U);
                // Check mipmaps are in order of increasing size in the file
                // therefore each offset should be smaller than the previous.
                EXPECT_LE(levelOffset, offset);
                offset = levelOffset;
            }

            EXPECT_EQ(helper.compareRawImages(levelIndex, ktxMemFile), true);

            delete ktxMemFile;
        } else {
            EXPECT_EQ(result, KTX_INVALID_OPERATION);
        }

        ktxTexture_Destroy(ktxTexture(texture));
        delete kvData;

    }